

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

void __thiscall
lest::success::success(success *this,text *kind_,location *where_,text *expr_,text *note_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  text local_b8;
  text local_98;
  text local_78;
  location local_58;
  
  pcVar2 = (kind_->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + kind_->_M_string_length);
  paVar1 = &local_58.file.field_2;
  pcVar2 = (where_->file)._M_dataplus._M_p;
  local_58.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (where_->file)._M_string_length);
  local_58.line = where_->line;
  pcVar2 = (expr_->_M_dataplus)._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + expr_->_M_string_length);
  pcVar2 = (note_->_M_dataplus)._M_p;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,pcVar2 + note_->_M_string_length);
  message::message(&this->super_message,&local_78,&local_58,&local_98,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  *(undefined ***)&this->super_message = &PTR__message_0018cc38;
  return;
}

Assistant:

success( text kind_, location where_, text expr_, text note_ = "" )
    : message( kind_, where_, expr_, note_) {}